

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v9::detail::print(detail *this,FILE *f,string_view text)

{
  char *pcVar1;
  undefined8 uVar2;
  uint *puVar3;
  string_view format_str;
  
  pcVar1 = (char *)fwrite(f,1,(size_t)text.data_,(FILE *)this);
  if (text.data_ <= pcVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x20);
  puVar3 = (uint *)__errno_location();
  format_str.data_ = (char *)(ulong)*puVar3;
  format_str.size_ = (size_t)"cannot write to file";
  vsystem_error((int)uVar2,format_str,(format_args)ZEXT816(0x14));
  __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
#ifdef _WIN32
  if (write_console(f, text)) return;
#endif
  detail::fwrite_fully(text.data(), 1, text.size(), f);
}